

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.cpp
# Opt level: O1

void __thiscall llvm::SmallPtrSetImplBase::shrink_and_clear(SmallPtrSetImplBase *this)

{
  uint uVar1;
  void **__s;
  uint uVar2;
  
  if (this->CurArray == this->SmallArray) {
    __assert_fail("!isSmall() && \"Can\'t shrink a small set!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SmallPtrSet.cpp"
                  ,0x1a,"void llvm::SmallPtrSetImplBase::shrink_and_clear()");
  }
  free(this->CurArray);
  uVar2 = this->NumNonEmpty - this->NumTombstones;
  uVar1 = 0x20;
  if (0x10 < uVar2) {
    uVar2 = uVar2 - 1;
    if (uVar2 != 0) {
      uVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      uVar1 = uVar1 ^ 0x1f;
    }
    uVar1 = 1 << (0x21U - (char)uVar1 & 0x1f);
  }
  this->CurArraySize = uVar1;
  this->NumNonEmpty = 0;
  this->NumTombstones = 0;
  __s = (void **)malloc((ulong)uVar1 << 3);
  if (__s == (void **)0x0) {
    report_bad_alloc_error("Allocation failed",true);
  }
  this->CurArray = __s;
  memset(__s,0xff,(ulong)this->CurArraySize << 3);
  return;
}

Assistant:

void SmallPtrSetImplBase::shrink_and_clear() {
  assert(!isSmall() && "Can't shrink a small set!");
  free(CurArray);

  // Reduce the number of buckets.
  unsigned Size = size();
  CurArraySize = Size > 16 ? 1 << (Log2_32_Ceil(Size) + 1) : 32;
  NumNonEmpty = NumTombstones = 0;

  // Install the new array.  Clear all the buckets to empty.
  CurArray = (const void**)safe_malloc(sizeof(void*) * CurArraySize);

  memset(CurArray, -1, CurArraySize*sizeof(void*));
}